

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

void __thiscall
Fossilize::ZipDatabase::ZipDatabase(ZipDatabase *this,string *path_,DatabaseMode mode_)

{
  __node_base_ptr *pp_Var1;
  long lVar2;
  
  DatabaseInterface::DatabaseInterface(&this->super_DatabaseInterface,mode_);
  (this->super_DatabaseInterface)._vptr_DatabaseInterface = (_func_int **)&PTR__ZipDatabase_002a1bd8
  ;
  std::__cxx11::string::string((string *)&this->path,(string *)path_);
  pp_Var1 = &this->seen_blobs[0]._M_h._M_single_bucket;
  lVar2 = 0x230;
  do {
    ((_Hashtable *)(pp_Var1 + -6))->_M_buckets = pp_Var1;
    pp_Var1[-5] = (__node_base_ptr)0x1;
    ((__node_base *)(pp_Var1 + -4))->_M_nxt = (_Hash_node_base *)0x0;
    pp_Var1[-3] = (__node_base_ptr)0x0;
    ((_Prime_rehash_policy *)(pp_Var1 + -2))->_M_max_load_factor = 1.0;
    pp_Var1[-1] = (__node_base_ptr)0x0;
    *pp_Var1 = (__node_base_ptr)0x0;
    pp_Var1 = pp_Var1 + 7;
    lVar2 = lVar2 + -0x38;
  } while (lVar2 != 0);
  this->mode = mode_;
  this->alive = false;
  if (mode_ == ExclusiveOverWrite) {
    this->mode = OverWrite;
  }
  mz_zip_zero_struct(&this->mz);
  return;
}

Assistant:

ZipDatabase(const string &path_, DatabaseMode mode_)
		: DatabaseInterface(mode_), path(path_), mode(mode_)
	{
		if (mode == DatabaseMode::ExclusiveOverWrite)
			mode = DatabaseMode::OverWrite;
		mz_zip_zero_struct(&mz);
	}